

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerSafe::CommandDiagReset
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aAddr,uint64_t aDiagDataFlags)

{
  pointer pcVar1;
  _func_void *p_Var2;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  CommissionerSafe *local_78;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  uint64_t local_30;
  
  local_78 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_70,aHandler);
  pcVar1 = (aAddr->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + aAddr->_M_string_length);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_30 = aDiagDataFlags;
  p_Var2 = (_func_void *)operator_new(0x50);
  *(CommissionerSafe **)p_Var2 = local_78;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_58;
  if (local_60 != (code *)0x0) {
    *(void **)(p_Var2 + 8) = local_70._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_70._8_8_;
    *(code **)(p_Var2 + 0x18) = local_60;
    local_60 = (code *)0x0;
    uStack_58 = 0;
  }
  *(_func_void **)(p_Var2 + 0x28) = p_Var2 + 0x38;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x28),local_50,local_50 + local_48);
  *(uint64_t *)(p_Var2 + 0x48) = local_30;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:579:22)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:579:22)>
             ::_M_manager;
  local_98._M_unused._M_function_pointer = p_Var2;
  PushAsyncRequest(this,(AsyncRequest *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::CommandDiagReset(ErrorHandler aHandler, const std::string &aAddr, uint64_t aDiagDataFlags)
{
    PushAsyncRequest([=]() { mImpl->CommandDiagReset(aHandler, aAddr, aDiagDataFlags); });
}